

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O2

void __thiscall
Catch::Capturer::captureValues<int,char>(Capturer *this,size_t index,int *value,char *values)

{
  string local_40;
  
  Detail::stringify<int>(&local_40,value);
  captureValue(this,index,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  captureValues<char>(this,index + 1,values);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }